

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void TestSuite::clearTestFile(string *prefix,TestPosition test_pos)

{
  string command;
  char *local_38 [2];
  char local_28 [16];
  
  if ((test_pos != END_OF_TEST) ||
     ((*(char *)(getCurTest()::cur_test + 0x39) == '\0' &&
      (*(char *)(getCurTest()::cur_test + 2) == '\0')))) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"rm -rf ","");
    std::__cxx11::string::_M_append((char *)local_38,(ulong)(prefix->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)local_38);
    system(local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return;
}

Assistant:

static void clearTestFile( const std::string& prefix,
                               TestPosition test_pos = MIDDLE_OF_TEST ) {
        TestSuite*& cur_test = TestSuite::getCurTest();
        if ( test_pos == END_OF_TEST &&
             ( cur_test->preserveTestFiles ||
               cur_test->options.preserveTestFiles ) ) return;

        int r;
#if defined(__linux__) || defined(__APPLE__)
        std::string command = "rm -rf ";
        command += prefix;
        command += "*";
        r = system(command.c_str());
        (void)r;

#elif defined(WIN32) || defined(_WIN32)
        std::string command = "del /s /f /q ";
        command += prefix;
        command += "* > NUL";
        r = system(command.c_str());
        (void)r;

        // Windows `del` operation cannot delete folders.
        // Just in case if there are any folders.
        WIN32_FIND_DATA filedata;
        HANDLE hfind;
        std::string query_str = prefix + "*";
        hfind = FindFirstFile(query_str.c_str(), &filedata);
        while (hfind != INVALID_HANDLE_VALUE) {
            std::string f_name(filedata.cFileName);
            size_t f_name_pos = f_name.find(prefix);
            if (f_name_pos != std::string::npos) {
                command = "rmdir /s /q " + f_name + " > NUL";
                r = system(command.c_str());
                (void)r;
            }

            if (!FindNextFile(hfind, &filedata)) {
                FindClose(hfind);
                hfind = INVALID_HANDLE_VALUE;
            }
        }
#endif
    }